

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_internal.cc
# Opt level: O2

optional<unsigned_long> __thiscall
absl::lts_20250127::status_internal::FindPayloadIndexByUrl
          (status_internal *this,Payloads *payloads,string_view type_url)

{
  bool bVar1;
  const_reference pVVar2;
  undefined8 uVar3;
  _Storage<unsigned_long,_true> unaff_RBX;
  optional<unsigned_long> oVar4;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  undefined8 extraout_RDX;
  
  if (this == (status_internal *)0x0) {
    uVar3 = 0;
  }
  else {
    for (unaff_RBX._M_value = 0; unaff_RBX._M_value < *(ulong *)this >> 1;
        unaff_RBX._M_value = unaff_RBX._M_value + 1) {
      pVVar2 = InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
               ::operator[]((InlinedVector<absl::lts_20250127::status_internal::Payload,_1UL,_std::allocator<absl::lts_20250127::status_internal::Payload>_>
                             *)this,unaff_RBX._M_value);
      __x._M_str = (pVVar2->type_url)._M_dataplus._M_p;
      __x._M_len = (pVVar2->type_url)._M_string_length;
      __y._M_str = (char *)type_url._M_len;
      __y._M_len = (size_t)payloads;
      bVar1 = std::operator==(__x,__y);
      if (bVar1) {
        uVar3 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
        goto LAB_002cb0bd;
      }
    }
    uVar3 = 0;
  }
LAB_002cb0bd:
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar3;
  oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = unaff_RBX._M_value;
  return (optional<unsigned_long>)
         oVar4.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

static absl::optional<size_t> FindPayloadIndexByUrl(
    const Payloads* payloads, absl::string_view type_url) {
  if (payloads == nullptr) return absl::nullopt;

  for (size_t i = 0; i < payloads->size(); ++i) {
    if ((*payloads)[i].type_url == type_url) return i;
  }

  return absl::nullopt;
}